

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

QStringList * __thiscall QFileDialog::history(QStringList *__return_storage_ptr__,QFileDialog *this)

{
  long lVar1;
  long lVar2;
  Data *pDVar3;
  long *plVar4;
  char cVar5;
  long lVar6;
  long in_FS_OFFSET;
  QStringView QVar7;
  int local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  long *local_78;
  QArrayData *local_70;
  QString local_58;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QDialog).super_QWidget.field_0x8;
  lVar6 = *(long *)(lVar1 + 0x370);
  if ((lVar6 == 0 | *(byte *)(lVar1 + 0x2c8)) == 1) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_004dd7c0:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    lVar2 = *(long *)(lVar6 + 0x18);
    pDVar3 = *(Data **)(lVar2 + 0x38);
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = *(QString **)(lVar2 + 0x40);
    (__return_storage_ptr__->d).size = *(qsizetype *)(lVar2 + 0x48);
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      lVar6 = *(long *)(lVar1 + 0x370);
    }
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::rootIndex((QModelIndex *)&local_38,*(QAbstractItemView **)(lVar6 + 0x88));
    plVar4 = *(long **)(lVar1 + 0x2e0);
    if (plVar4 == (long *)0x0) {
      local_78 = (long *)local_38._16_8_;
      local_88 = local_38._0_4_;
      uStack_84 = local_38._4_4_;
      uStack_80 = local_38._8_4_;
      uStack_7c = local_38._12_4_;
    }
    else {
      (**(code **)(*plVar4 + 400))(&local_88,plVar4,&local_38);
    }
    if (local_78 == (long *)0x0) {
      local_38.shared = (PrivateShared *)0x0;
      local_38._8_8_ = 0;
      local_38._16_8_ = (long *)0x0;
      local_20 = 2;
    }
    else {
      (**(code **)(*local_78 + 0x90))(&local_38,local_78,&local_88,0x101);
    }
    ::QVariant::toString();
    QDir::toNativeSeparators((QString *)&local_58);
    if (local_70 != (QArrayData *)0x0) {
      LOCK();
      (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70,2,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)&local_38);
    QVar7.m_data = local_58.d.ptr;
    QVar7.m_size = local_58.d.size;
    cVar5 = QtPrivate::QStringList_contains
                      ((QList_conflict *)__return_storage_ptr__,QVar7,CaseSensitive);
    if (cVar5 == '\0') {
      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_58);
      QList<QString>::end(__return_storage_ptr__);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_004dd7c0;
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QFileDialog::history() const
{
    Q_D(const QFileDialog);
    if (!d->usingWidgets())
        return QStringList();
    QStringList currentHistory = d->qFileDialogUi->lookInCombo->history();
    //On windows the popup display the "C:\", convert to nativeSeparators
    QString newHistory = QDir::toNativeSeparators(d->rootIndex().data(QFileSystemModel::FilePathRole).toString());
    if (!currentHistory.contains(newHistory))
        currentHistory << newHistory;
    return currentHistory;
}